

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_40x(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x3fa].name == (char *)0x0) && (env->spr[0x3fa] == 0)) &&
      (env->spr_cb[0x3fa].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3fa].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3fa].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3fa].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3fa].name = "DCCR";
    env->spr_cb[0x3fa].uea_read = spr_noaccess;
    env->spr_cb[0x3fa].uea_write = spr_noaccess;
    env->spr_cb[0x3fa].oea_read = spr_read_generic;
    env->spr_cb[0x3fa].oea_write = spr_write_generic;
    env->spr_cb[0x3fa].hea_read = spr_read_generic;
    env->spr_cb[0x3fa].hea_write = spr_write_generic;
    env->spr_cb[0x3fa].default_value = 0;
    env->spr[0x3fa] = 0;
    if (((env->spr_cb[0x3fb].name == (char *)0x0) && (env->spr[0x3fb] == 0)) &&
       ((env->spr_cb[0x3fb].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3fb].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3fb].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3fb].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3fb].name = "ICCR";
      env->spr_cb[0x3fb].uea_read = spr_noaccess;
      env->spr_cb[0x3fb].uea_write = spr_noaccess;
      env->spr_cb[0x3fb].oea_read = spr_read_generic;
      env->spr_cb[0x3fb].oea_write = spr_write_generic;
      env->spr_cb[0x3fb].hea_read = spr_read_generic;
      env->spr_cb[0x3fb].hea_write = spr_write_generic;
      env->spr_cb[0x3fb].default_value = 0;
      env->spr[0x3fb] = 0;
      if (((env->spr_cb[0x3d3].name == (char *)0x0) && (env->spr[0x3d3] == 0)) &&
         (((env->spr_cb[0x3d3].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3d3].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3d3].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x3d3].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x3d3].name = "ICDBDR";
        env->spr_cb[0x3d3].uea_read = spr_noaccess;
        env->spr_cb[0x3d3].uea_write = spr_noaccess;
        env->spr_cb[0x3d3].oea_read = spr_read_generic;
        env->spr_cb[0x3d3].oea_write = spr_noaccess;
        env->spr_cb[0x3d3].hea_read = spr_read_generic;
        env->spr_cb[0x3d3].hea_write = spr_noaccess;
        env->spr_cb[0x3d3].default_value = 0;
        env->spr[0x3d3] = 0;
        if (((((env->spr_cb[0x3d5].name == (char *)0x0) && (env->spr[0x3d5] == 0)) &&
             (env->spr_cb[0x3d5].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3d5].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3d5].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3d5].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3d5].name = "DEAR";
          env->spr_cb[0x3d5].uea_read = spr_noaccess;
          env->spr_cb[0x3d5].uea_write = spr_noaccess;
          env->spr_cb[0x3d5].oea_read = spr_read_generic;
          env->spr_cb[0x3d5].oea_write = spr_write_generic;
          env->spr_cb[0x3d5].hea_read = spr_read_generic;
          env->spr_cb[0x3d5].hea_write = spr_write_generic;
          env->spr_cb[0x3d5].default_value = 0;
          env->spr[0x3d5] = 0;
          if (((env->spr_cb[0x3d4].name == (char *)0x0) && (env->spr[0x3d4] == 0)) &&
             ((env->spr_cb[0x3d4].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3d4].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3d4].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3d4].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3d4].name = "ESR";
            env->spr_cb[0x3d4].uea_read = spr_noaccess;
            env->spr_cb[0x3d4].uea_write = spr_noaccess;
            env->spr_cb[0x3d4].oea_read = spr_read_generic;
            env->spr_cb[0x3d4].oea_write = spr_write_generic;
            env->spr_cb[0x3d4].hea_read = spr_read_generic;
            env->spr_cb[0x3d4].hea_write = spr_write_generic;
            env->spr_cb[0x3d4].default_value = 0;
            env->spr[0x3d4] = 0;
            if ((((env->spr_cb[0x3d6].name == (char *)0x0) && (env->spr[0x3d6] == 0)) &&
                ((env->spr_cb[0x3d6].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x3d6].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x3d6].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x3d6].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x3d6].name = "EVPR";
              env->spr_cb[0x3d6].uea_read = spr_noaccess;
              env->spr_cb[0x3d6].uea_write = spr_noaccess;
              env->spr_cb[0x3d6].oea_read = spr_read_generic;
              env->spr_cb[0x3d6].oea_write = spr_write_excp_prefix;
              env->spr_cb[0x3d6].hea_read = spr_read_generic;
              env->spr_cb[0x3d6].hea_write = spr_write_excp_prefix;
              env->spr_cb[0x3d6].default_value = 0;
              env->spr[0x3d6] = 0;
              if ((((env->spr_cb[0x3de].name == (char *)0x0) && (env->spr[0x3de] == 0)) &&
                  (env->spr_cb[0x3de].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                 (((env->spr_cb[0x3de].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x3de].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  (env->spr_cb[0x3de].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
                env->spr_cb[0x3de].name = "SRR2";
                env->spr_cb[0x3de].uea_read = spr_read_generic;
                env->spr_cb[0x3de].uea_write = spr_write_generic;
                env->spr_cb[0x3de].oea_read = spr_read_generic;
                env->spr_cb[0x3de].oea_write = spr_write_generic;
                env->spr_cb[0x3de].hea_read = spr_read_generic;
                env->spr_cb[0x3de].hea_write = spr_write_generic;
                env->spr_cb[0x3de].default_value = 0;
                env->spr[0x3de] = 0;
                if (((env->spr_cb[0x3df].name == (char *)0x0) && (env->spr[0x3df] == 0)) &&
                   ((env->spr_cb[0x3df].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x3df].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x3df].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x3df].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x3df].name = "SRR3";
                  env->spr_cb[0x3df].uea_read = spr_read_generic;
                  env->spr_cb[0x3df].uea_write = spr_write_generic;
                  env->spr_cb[0x3df].oea_read = spr_read_generic;
                  env->spr_cb[0x3df].oea_write = spr_write_generic;
                  env->spr_cb[0x3df].hea_read = spr_read_generic;
                  env->spr_cb[0x3df].hea_write = spr_write_generic;
                  env->spr_cb[0x3df].default_value = 0;
                  env->spr[0x3df] = 0;
                  if (((env->spr_cb[0x3db].name == (char *)0x0) && (env->spr[0x3db] == 0)) &&
                     (((env->spr_cb[0x3db].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x3db].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x3db].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x3db].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x3db].name = "PIT";
                    env->spr_cb[0x3db].uea_read = spr_noaccess;
                    env->spr_cb[0x3db].uea_write = spr_noaccess;
                    env->spr_cb[0x3db].oea_read = spr_read_40x_pit;
                    env->spr_cb[0x3db].oea_write = spr_write_40x_pit;
                    env->spr_cb[0x3db].hea_read = spr_read_40x_pit;
                    env->spr_cb[0x3db].hea_write = spr_write_40x_pit;
                    env->spr_cb[0x3db].default_value = 0;
                    env->spr[0x3db] = 0;
                    if (((((env->spr_cb[0x3da].name == (char *)0x0) && (env->spr[0x3da] == 0)) &&
                         (env->spr_cb[0x3da].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)
                         ) && ((env->spr_cb[0x3da].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3da].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                       (env->spr_cb[0x3da].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0))
                    {
                      env->spr_cb[0x3da].name = "TCR";
                      env->spr_cb[0x3da].uea_read = spr_noaccess;
                      env->spr_cb[0x3da].uea_write = spr_noaccess;
                      env->spr_cb[0x3da].oea_read = spr_read_generic;
                      env->spr_cb[0x3da].oea_write = spr_write_booke_tcr;
                      env->spr_cb[0x3da].hea_read = spr_read_generic;
                      env->spr_cb[0x3da].hea_write = spr_write_booke_tcr;
                      env->spr_cb[0x3da].default_value = 0;
                      env->spr[0x3da] = 0;
                      if (((env->spr_cb[0x3d8].name == (char *)0x0) && (env->spr[0x3d8] == 0)) &&
                         ((env->spr_cb[0x3d8].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0
                          && (((env->spr_cb[0x3d8].oea_write ==
                                (_func_void_DisasContext_ptr_int_int *)0x0 &&
                               (env->spr_cb[0x3d8].uea_read ==
                                (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                              (env->spr_cb[0x3d8].uea_write ==
                               (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
                        env->spr_cb[0x3d8].name = "TSR";
                        env->spr_cb[0x3d8].uea_read = spr_noaccess;
                        env->spr_cb[0x3d8].uea_write = spr_noaccess;
                        env->spr_cb[0x3d8].oea_read = spr_read_generic;
                        env->spr_cb[0x3d8].oea_write = spr_write_booke_tsr;
                        env->spr_cb[0x3d8].hea_read = spr_read_generic;
                        env->spr_cb[0x3d8].hea_write = spr_write_booke_tsr;
                        env->spr_cb[0x3d8].default_value = 0;
                        env->spr[0x3d8] = 0;
                        return;
                      }
                      uVar2 = 0x3d8;
                      uVar1 = 0x3d8;
                    }
                    else {
                      uVar2 = 0x3da;
                      uVar1 = 0x3da;
                    }
                  }
                  else {
                    uVar2 = 0x3db;
                    uVar1 = 0x3db;
                  }
                }
                else {
                  uVar2 = 0x3df;
                  uVar1 = 0x3df;
                }
              }
              else {
                uVar2 = 0x3de;
                uVar1 = 0x3de;
              }
            }
            else {
              uVar2 = 0x3d6;
              uVar1 = 0x3d6;
            }
          }
          else {
            uVar2 = 0x3d4;
            uVar1 = 0x3d4;
          }
        }
        else {
          uVar2 = 0x3d5;
          uVar1 = 0x3d5;
        }
      }
      else {
        uVar2 = 0x3d3;
        uVar1 = 0x3d3;
      }
    }
    else {
      uVar2 = 0x3fb;
      uVar1 = 0x3fb;
    }
  }
  else {
    uVar2 = 0x3fa;
    uVar1 = 0x3fa;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_40x(CPUPPCState *env)
{
    /* Cache */
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_40x_DCCR, "DCCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_40x_ICCR, "ICCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_BOOKE_ICDBDR, "ICDBDR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, SPR_NOACCESS,
                 0x00000000);
    /* Exception */
    spr_register(env, SPR_40x_DEAR, "DEAR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_ESR, "ESR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_EVPR, "EVPR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_excp_prefix,
                 0x00000000);
    spr_register(env, SPR_40x_SRR2, "SRR2",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_40x_SRR3, "SRR3",
                 &spr_read_generic, &spr_write_generic,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Timers */
    spr_register(env, SPR_40x_PIT, "PIT",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_40x_pit, &spr_write_40x_pit,
                 0x00000000);
    spr_register(env, SPR_40x_TCR, "TCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_booke_tcr,
                 0x00000000);
    spr_register(env, SPR_40x_TSR, "TSR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_booke_tsr,
                 0x00000000);
}